

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O3

REF_STATUS ref_layer_align_prism(REF_GRID ref_grid,REF_DICT ref_dict_bcs)

{
  size_t __size;
  int *piVar1;
  REF_DBL *pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  REF_STATUS RVar5;
  REF_BOOL RVar6;
  REF_INT RVar7;
  uint uVar8;
  void *pvVar9;
  REF_ADJ pRVar10;
  REF_INT *pRVar11;
  REF_CELL pRVar12;
  long lVar13;
  REF_INT *pRVar14;
  undefined8 uVar15;
  ulong uVar16;
  int iVar17;
  void *pvVar18;
  REF_NODE pRVar19;
  REF_CAVITY ref_cavity_00;
  char *pcVar20;
  ulong uVar21;
  ulong unaff_R12;
  int iVar22;
  REF_INT RVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  REF_GRID ref_grid_00;
  REF_CELL pRVar28;
  int iVar29;
  REF_GEOM pRVar30;
  bool bVar31;
  double dVar32;
  REF_GEOM pRVar33;
  REF_INT new_node;
  REF_CAVITY ref_cavity;
  REF_BOOL has_side;
  REF_GLOB global;
  REF_INT bc_1;
  REF_CAVITY ref_cavity_1;
  REF_INT nodes [27];
  REF_DBL tri_normal [3];
  REF_INT bc;
  long local_648;
  int local_63c;
  REF_GRID local_638;
  REF_CELL local_630;
  ulong local_628;
  void *local_620;
  REF_GEOM local_618;
  REF_CAVITY local_610;
  undefined8 local_608;
  REF_NODE local_5f0;
  uint local_5e8;
  undefined4 uStack_5e4;
  int local_5dc;
  REF_GEOM local_5d8;
  void *local_5d0;
  REF_GEOM local_5c8;
  int local_5c0;
  REF_INT local_5bc;
  long local_5b8;
  long local_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  int local_538 [28];
  undefined8 local_4c8;
  double dStack_4c0;
  double local_4b8;
  ulong local_450;
  long local_448;
  ulong local_440;
  undefined8 local_438;
  REF_INT local_430;
  REF_INT RStack_42c;
  double local_428;
  double local_420;
  double local_418;
  double local_410;
  
  pRVar19 = ref_grid->node;
  pRVar12 = ref_grid->cell[3];
  uVar4 = ref_node_synchronize_globals(pRVar19);
  if (uVar4 != 0) {
    unaff_R12 = (ulong)uVar4;
    pcVar20 = "sync glob";
    uVar15 = 0x472;
    goto LAB_001ef6fe;
  }
  uVar4 = ref_export_by_extension(ref_grid,"ref_layer_prism_before.tec");
  if (uVar4 != 0) {
    unaff_R12 = (ulong)uVar4;
    pcVar20 = "dump surf";
    uVar15 = 0x475;
    goto LAB_001ef6fe;
  }
  iVar29 = pRVar19->max;
  if ((long)iVar29 < 0) {
    pcVar20 = "malloc active of REF_BOOL negative";
    uVar15 = 0x477;
LAB_001ef7a5:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar15,
           "ref_layer_align_prism",pcVar20);
    return 1;
  }
  __size = (long)iVar29 * 4;
  local_5d0 = malloc(__size);
  if (local_5d0 == (void *)0x0) {
    pcVar20 = "malloc active of REF_BOOL NULL";
    uVar15 = 0x477;
    goto LAB_001f0319;
  }
  if (iVar29 == 0) {
    pvVar9 = malloc(__size);
    if (pvVar9 == (void *)0x0) goto LAB_001f02f8;
  }
  else {
    memset(local_5d0,0,__size);
    pvVar9 = malloc(__size);
    if (pvVar9 == (void *)0x0) {
LAB_001f02f8:
      pcVar20 = "malloc off_node of REF_BOOL NULL";
      uVar15 = 0x478;
LAB_001f0319:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
             uVar15,"ref_layer_align_prism",pcVar20);
      return 2;
    }
    memset(pvVar9,0xff,__size);
  }
  pvVar18 = local_5d0;
  local_630 = pRVar12;
  local_620 = pvVar9;
  if (0 < pRVar12->max) {
    unaff_R12 = 0;
    iVar29 = 0;
    do {
      RVar5 = ref_cell_nodes(pRVar12,iVar29,local_538);
      if (RVar5 == 0) {
        local_438._0_4_ = -1;
        uVar4 = ref_dict_value(ref_dict_bcs,local_538[pRVar12->node_per],(REF_INT *)&local_438);
        if ((uVar4 != 0) && (uVar4 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x47d);
          unaff_R12 = (ulong)uVar4;
        }
        if ((((uVar4 == 5) || (uVar4 == 0)) &&
            (RVar6 = ref_phys_wall_distance_bc((int)local_438), RVar6 != 0)) &&
           (iVar22 = local_630->node_per, 0 < (long)iVar22)) {
          lVar13 = 0;
          do {
            *(undefined4 *)((long)pvVar18 + (long)local_538[lVar13] * 4) = 1;
            lVar13 = lVar13 + 1;
          } while (iVar22 != lVar13);
        }
        pRVar12 = local_630;
        if ((uVar4 != 5) && (uVar4 != 0)) {
          return (REF_STATUS)unaff_R12;
        }
      }
      iVar29 = iVar29 + 1;
    } while (iVar29 < pRVar12->max);
  }
  pRVar30 = (REF_GEOM)ref_grid->node;
  local_638 = ref_grid;
  if (0 < pRVar30->max) {
    local_5f0 = (REF_NODE)ref_grid->cell[3];
    lVar13 = 0;
    do {
      if (((*(long *)((long)pRVar30->descr + lVar13 * 8) < 0) ||
          (((REF_MPI)pRVar30->tolerance_protection)->id !=
           *(int *)((long)pRVar30->initial_cell_height + lVar13 * 4))) ||
         (*(int *)((long)pvVar18 + lVar13 * 4) == 0)) goto LAB_001efe26;
      local_5a8 = (REF_CAVITY)0x0;
      uStack_5a0 = 0.0;
      local_598 = 0.0;
      piVar1 = *(int **)&local_5f0->naux;
      bVar31 = true;
      if ((lVar13 < *piVar1) &&
         (iVar29 = *(int *)(*(long *)(piVar1 + 2) + lVar13 * 4), iVar29 != -1)) {
        lVar24 = *(long *)(piVar1 + 4);
        RVar23 = -1;
        local_5d8 = (REF_GEOM)((ulong)local_5d8 & 0xffffffff00000000);
        pRVar19 = local_5f0;
        local_618 = pRVar30;
        do {
          local_628 = CONCAT44(local_628._4_4_,RVar23);
          lVar24 = (long)*(int *)(lVar24 + (long)iVar29 * 8 + 4);
          RVar23 = *(REF_INT *)
                    ((long)pRVar19->real +
                    (pRVar19->blank * lVar24 + (long)*(int *)&pRVar19->field_0xc) * 4);
          uVar4 = ref_dict_value(ref_dict_bcs,RVar23,&local_5bc);
          if ((uVar4 != 0) && (uVar4 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x3f7,"ref_layer_prism_insert_hair");
            unaff_R12 = (ulong)uVar4;
          }
          if ((uVar4 != 5) && (uVar4 != 0)) {
            pRVar12 = local_630;
            ref_grid = local_638;
            if ((int)unaff_R12 == 0) goto LAB_001efe3e;
            goto LAB_001f1648;
          }
          RVar6 = ref_phys_wall_distance_bc(local_5bc);
          pRVar19 = local_5f0;
          if (RVar6 == 0) {
            local_5d8 = (REF_GEOM)CONCAT44(local_5d8._4_4_,1);
            if ((REF_INT)local_628 != RVar23 && (REF_INT)local_628 != -1) {
              pcVar20 = "multiple face constraints";
              uVar15 = 0x402;
              goto LAB_001f0f82;
            }
          }
          else {
            uVar4 = ref_node_tri_normal((REF_NODE)local_618,
                                        (REF_INT *)
                                        (local_5f0->blank * lVar24 * 4 + (long)local_5f0->real),
                                        (REF_DBL *)&local_4c8);
            if (uVar4 != 0) {
              pcVar20 = "tri norm";
              uVar15 = 0x3fb;
              goto LAB_001f163b;
            }
            local_5a8 = (REF_CAVITY)
                        ((double)CONCAT44(local_4c8._4_4_,(uint)local_4c8) + (double)local_5a8);
            uStack_5a0 = dStack_4c0 + uStack_5a0;
            local_598 = local_4b8 + local_598;
            RVar23 = (REF_INT)local_628;
          }
          lVar24 = *(long *)(*(long *)&pRVar19->naux + 0x10);
          iVar29 = *(int *)(lVar24 + (long)iVar29 * 8);
        } while (iVar29 != -1);
        local_628 = CONCAT44(local_628._4_4_,RVar23);
        bVar31 = (int)local_5d8 == 0;
        ref_grid = local_638;
        pRVar30 = local_618;
      }
      else {
        local_628 = CONCAT44(local_628._4_4_,0xffffffff);
      }
      uVar4 = ref_math_normalize((REF_DBL *)&local_5a8);
      if (uVar4 != 0) {
        pcVar20 = "norm";
        uVar15 = 0x406;
LAB_001f163b:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               uVar15,"ref_layer_prism_insert_hair",(ulong)uVar4,pcVar20);
        unaff_R12 = (ulong)uVar4;
LAB_001f1648:
        pcVar20 = "insert hair";
        uVar15 = 0x487;
        goto LAB_001ef6fe;
      }
      RVar23 = (REF_INT)lVar13;
      uVar4 = ref_node_metric_get((REF_NODE)pRVar30,RVar23,(REF_DBL *)&local_438);
      if (uVar4 != 0) {
        pcVar20 = "get";
        uVar15 = 0x407;
        goto LAB_001f163b;
      }
      dVar32 = (local_410 * local_598 + local_428 * (double)local_5a8 + uStack_5a0 * local_418) *
               local_598 +
               (local_428 * local_598 +
               (double)CONCAT44(local_438._4_4_,(int)local_438) * (double)local_5a8 +
               (double)CONCAT44(RStack_42c,local_430) * uStack_5a0) * (double)local_5a8 +
               (local_418 * local_598 +
               (double)CONCAT44(RStack_42c,local_430) * (double)local_5a8 + local_420 * uStack_5a0)
               * uStack_5a0;
      if (dVar32 <= 0.0) {
        pcVar20 = "ratio not positive";
        uVar15 = 0x409;
LAB_001f0f82:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               uVar15,"ref_layer_prism_insert_hair",pcVar20);
        unaff_R12 = 1;
        goto LAB_001f1648;
      }
      if (dVar32 < 0.0) {
        pRVar33 = (REF_GEOM)sqrt(dVar32);
      }
      else {
        pRVar33 = (REF_GEOM)SQRT(dVar32);
      }
      dVar32 = (double)pRVar33 * 1e+20;
      if (dVar32 <= -dVar32) {
        dVar32 = -dVar32;
      }
      if (dVar32 <= 1.0) {
        pcVar20 = "1/ratio is inf 1/0";
        uVar15 = 0x40b;
        goto LAB_001f0f82;
      }
      local_618 = pRVar33;
      uVar4 = ref_node_next_global((REF_NODE)pRVar30,(REF_GLOB *)&local_5e8);
      if (uVar4 != 0) {
        pcVar20 = "next global";
        uVar15 = 0x40d;
        goto LAB_001f163b;
      }
      uVar4 = ref_node_add((REF_NODE)pRVar30,CONCAT44(uStack_5e4,local_5e8),&local_63c);
      if (uVar4 != 0) {
        pcVar20 = "add";
        uVar15 = 0x40e;
        goto LAB_001f163b;
      }
      dVar32 = 1.0 / (double)local_618;
      lVar24 = (long)local_63c;
      *(int *)((long)local_620 + lVar13 * 4) = local_63c;
      pRVar2 = pRVar30->face_seg_per_rad;
      pRVar2[lVar24 * 0xf] = (double)local_5a8 * dVar32 + pRVar2[lVar13 * 0xf];
      pRVar2[lVar24 * 0xf + 1] = uStack_5a0 * dVar32 + pRVar2[lVar13 * 0xf + 1];
      pRVar2[lVar24 * 0xf + 2] = dVar32 * local_598 + pRVar2[lVar13 * 0xf + 2];
      if (!bVar31) {
        local_618 = ref_grid->geom;
        RVar7 = (REF_INT)local_628;
        uVar4 = ref_geom_tuv(local_618,RVar23,2,(REF_INT)local_628,(REF_DBL *)&local_608);
        pRVar12 = local_630;
        if (uVar4 == 0) {
          uVar4 = ref_egads_inverse_eval
                            (local_618,2,RVar7,pRVar30->face_seg_per_rad + (long)local_63c * 0xf,
                             (REF_DBL *)&local_608);
          if (uVar4 == 0) {
            uVar4 = ref_egads_eval_at(local_618,2,RVar7,(REF_DBL *)&local_608,
                                      pRVar30->face_seg_per_rad + (long)local_63c * 0xf,
                                      (REF_DBL *)0x0);
            if (uVar4 == 0) {
              uVar4 = ref_geom_add(local_618,local_63c,2,RVar7,(REF_DBL *)&local_608);
              if (uVar4 == 0) {
                *(undefined4 *)((long)local_620 + lVar13 * 4) = 0xffffffff;
                uVar4 = ref_geom_remove_all(local_618,local_63c);
                if (uVar4 == 0) {
                  uVar4 = ref_node_remove((REF_NODE)pRVar30,local_63c);
                  if (uVar4 == 0) goto LAB_001efe26;
                  pcVar20 = "rm node";
                  uVar15 = 0x429;
                }
                else {
                  pcVar20 = "rm geom";
                  uVar15 = 0x428;
                }
              }
              else {
                pcVar20 = "add param";
                uVar15 = 0x425;
              }
              goto LAB_001f163b;
            }
            pcVar20 = "inv eval";
            uVar15 = 0x422;
          }
          else {
            pcVar20 = "inv eval";
            uVar15 = 0x41e;
          }
        }
        else {
          pcVar20 = "base param";
          uVar15 = 0x41b;
        }
        unaff_R12 = (ulong)uVar4;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               uVar15,"ref_layer_prism_insert_hair",(ulong)uVar4,pcVar20);
        goto LAB_001f1648;
      }
      uVar4 = ref_cavity_create(&local_610);
      if (uVar4 != 0) {
        pcVar20 = "cav create";
        uVar15 = 0x457;
        goto LAB_001f163b;
      }
      uVar4 = ref_cavity_form_insert_tet(local_610,ref_grid,local_63c,RVar23,-1);
      if (uVar4 != 0) {
        pcVar20 = "ball";
        uVar15 = 0x45a;
        goto LAB_001f163b;
      }
      uVar4 = ref_cavity_enlarge_combined(local_610);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x45e,"ref_layer_prism_insert_hair",(ulong)uVar4,"enlarge");
        ref_cavity_tec(local_610,"cav-fail.tec");
        pcVar20 = "mesh-fail.tec";
LAB_001f15c1:
        ref_export_by_extension(ref_grid,pcVar20);
        unaff_R12 = (ulong)uVar4;
        goto LAB_001f1648;
      }
      uVar4 = ref_cavity_replace(local_610);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x462,"ref_layer_prism_insert_hair",(ulong)uVar4,"cav replace");
        ref_cavity_tec(local_610,"ref_layer_prism_cavity.tec");
        pcVar20 = "ref_layer_prism_mesh.tec";
        goto LAB_001f15c1;
      }
      uVar4 = ref_cavity_free(local_610);
      pRVar12 = local_630;
      if (uVar4 != 0) {
        pcVar20 = "cav free";
        uVar15 = 0x463;
        goto LAB_001f163b;
      }
LAB_001efe26:
      lVar13 = lVar13 + 1;
      pvVar18 = local_5d0;
    } while (lVar13 < pRVar30->max);
  }
LAB_001efe3e:
  if (0 < pRVar12->max) {
    uVar25 = 0;
    pvVar9 = local_620;
    do {
      RVar5 = ref_cell_nodes(pRVar12,(int)uVar25,local_538);
      if ((((RVar5 == 0) && (*(int *)((long)pvVar9 + (long)local_538[0] * 4) != -1)) &&
          (*(int *)((long)pvVar9 + (long)local_538[1] * 4) != -1)) &&
         ((*(int *)((long)pvVar9 + (long)local_538[2] * 4) != -1 && (0 < pRVar12->edge_per)))) {
        local_5b8 = (long)(int)uVar25;
        lVar13 = 0;
LAB_001efeb7:
        lVar24 = pRVar12->size_per * local_5b8;
        uVar4 = *(uint *)((long)pvVar9 + (long)pRVar12->c2n[pRVar12->e2n[lVar13 * 2] + lVar24] * 4);
        uVar16 = (ulong)uVar4;
        RVar23 = *(REF_INT *)
                  ((long)pvVar9 +
                  (long)pRVar12->c2n[(long)(int)lVar24 + (long)pRVar12->e2n[lVar13 * 2 + 1]] * 4);
        local_5b0 = lVar13;
        uVar8 = ref_cell_has_side(ref_grid->cell[8],uVar4,RVar23,(REF_BOOL *)&local_608);
        if (uVar8 == 0) {
          if ((int)local_608 == 0) {
            local_450 = uVar25;
            if (-1 < (int)uVar4) {
              pRVar28 = ref_grid->cell[8];
              pRVar10 = pRVar28->ref_adj;
              if (((int)uVar4 < pRVar10->nnode) &&
                 (lVar13 = (long)pRVar10->first[uVar16], lVar13 != -1)) {
                pRVar19 = ref_grid->node;
                pRVar3 = pRVar10->item + lVar13;
                uVar25 = (ulong)(uint)pRVar28->face_per;
                local_5dc = -1;
                local_5c8 = (REF_GEOM)0xe974e718d7d7625a;
                local_5f0 = pRVar19;
                local_440 = uVar16;
                do {
                  if (0 < (int)uVar25) {
                    local_5c0 = pRVar3->ref;
                    uVar21 = (ulong)local_5c0;
                    lVar24 = 4;
                    lVar26 = 0;
                    local_628 = uVar21;
                    local_448 = lVar13;
                    do {
                      pRVar14 = pRVar28->f2n;
                      pRVar11 = pRVar28->c2n;
                      lVar13 = (long)pRVar28->size_per * uVar21;
                      iVar29 = (int)uVar16;
                      if (((pRVar11[*(int *)((long)pRVar14 + lVar24 + -4) + lVar13] != iVar29) &&
                          (lVar13 = (long)(int)lVar13,
                          pRVar11[*(int *)((long)pRVar14 + lVar24) + lVar13] != iVar29)) &&
                         (pRVar11[*(int *)((long)pRVar14 + lVar24 + 4) + lVar13] != iVar29)) {
                        local_430 = pRVar11[*(int *)((long)pRVar14 + lVar24) + lVar13];
                        RStack_42c = pRVar11[*(int *)((long)pRVar14 + lVar24 + -4) + lVar13];
                        local_438._0_4_ = iVar29;
                        local_438._4_4_ = RVar23;
                        uVar4 = ref_node_tet_vol(pRVar19,(REF_INT *)&local_438,(REF_DBL *)&local_4c8
                                                );
                        uVar25 = local_628;
                        if (uVar4 == 0) {
                          local_618 = (REF_GEOM)CONCAT44(local_4c8._4_4_,(uint)local_4c8);
                          lVar13 = (long)pRVar28->size_per * local_628;
                          local_430 = pRVar28->c2n
                                      [*(int *)((long)pRVar28->f2n + lVar24 + 4) + lVar13];
                          RStack_42c = pRVar28->c2n
                                       [(long)(int)lVar13 +
                                        (long)*(int *)((long)pRVar28->f2n + lVar24)];
                          local_438._0_4_ = iVar29;
                          local_438._4_4_ = RVar23;
                          uVar4 = ref_node_tet_vol(local_5f0,(REF_INT *)&local_438,
                                                   (REF_DBL *)&local_4c8);
                          pRVar19 = local_5f0;
                          if (uVar4 == 0) {
                            local_5d8 = (REF_GEOM)CONCAT44(local_4c8._4_4_,(uint)local_4c8);
                            lVar13 = (long)pRVar28->size_per * uVar25;
                            local_430 = pRVar28->c2n
                                        [*(int *)((long)pRVar28->f2n + lVar24 + -4) + lVar13];
                            RStack_42c = pRVar28->c2n
                                         [(long)(int)lVar13 +
                                          (long)*(int *)((long)pRVar28->f2n + lVar24 + 4)];
                            local_438._0_4_ = iVar29;
                            local_438._4_4_ = RVar23;
                            uVar4 = ref_node_tet_vol(local_5f0,(REF_INT *)&local_438,
                                                     (REF_DBL *)&local_4c8);
                            if (uVar4 == 0) {
                              pRVar30 = (REF_GEOM)0x6974e718d7d7625a;
                              if ((double)local_618 <= 1e+200) {
                                pRVar30 = local_618;
                              }
                              if ((double)local_5d8 <= (double)pRVar30) {
                                pRVar30 = local_5d8;
                              }
                              if ((double)CONCAT44(local_4c8._4_4_,(uint)local_4c8) <=
                                  (double)pRVar30) {
                                pRVar30 = (REF_GEOM)CONCAT44(local_4c8._4_4_,(uint)local_4c8);
                              }
                              uVar21 = local_628;
                              uVar16 = local_440;
                              if ((double)local_5c8 < (double)pRVar30) {
                                local_5dc = local_5c0;
                                local_5c8 = pRVar30;
                              }
                              goto LAB_001f01d4;
                            }
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x34f,"ref_layer_seed_tet",(ulong)uVar4,"vol");
                            unaff_R12 = (ulong)uVar4;
                            goto LAB_001f13ef;
                          }
                          uVar15 = 0x349;
                        }
                        else {
                          uVar15 = 0x343;
                        }
                        unaff_R12 = (ulong)uVar4;
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,uVar15,"ref_layer_seed_tet",unaff_R12,"vol");
                        goto LAB_001f13ef;
                      }
LAB_001f01d4:
                      lVar26 = lVar26 + 1;
                      uVar25 = (ulong)pRVar28->face_per;
                      lVar24 = lVar24 + 0x10;
                    } while (lVar26 < (long)uVar25);
                    pRVar10 = pRVar28->ref_adj;
                    pRVar12 = local_630;
                    lVar13 = local_448;
                    ref_grid = local_638;
                  }
                  iVar29 = local_5dc;
                  lVar13 = (long)pRVar10->item[(int)lVar13].next;
                  if (lVar13 == -1) goto LAB_001f021c;
                  pRVar3 = pRVar10->item + lVar13;
                } while( true );
              }
            }
            goto LAB_001f13c1;
          }
          goto LAB_001eff22;
        }
        unaff_R12 = (ulong)uVar8;
        pcVar20 = "find tet side";
        uVar15 = 0x493;
        goto LAB_001ef6fe;
      }
LAB_001efe68:
      uVar4 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar4;
    } while ((int)uVar4 < pRVar12->max);
    if (0 < pRVar12->max) {
      iVar29 = 0;
      do {
        RVar5 = ref_cell_nodes(pRVar12,iVar29,local_538);
        if (((RVar5 == 0) && (*(int *)((long)pvVar9 + (long)local_538[0] * 4) != -1)) &&
           ((*(int *)((long)pvVar9 + (long)local_538[1] * 4) != -1 &&
            ((*(int *)((long)pvVar9 + (long)local_538[2] * 4) != -1 && (0 < local_630->edge_per)))))
           ) {
          local_628 = (ulong)iVar29;
          lVar13 = 0;
          do {
            pRVar12 = local_630;
            lVar24 = (long)local_630->size_per * local_628;
            uVar4 = ref_cell_has_side(ref_grid->cell[8],
                                      local_630->c2n[local_630->e2n[lVar13 * 2] + lVar24],
                                      *(REF_INT *)
                                       ((long)pvVar9 +
                                       (long)local_630->c2n
                                             [(long)(int)lVar24 +
                                              (long)local_630->e2n[lVar13 * 2 + 1]] * 4),
                                      (REF_BOOL *)&local_608);
            if (uVar4 != 0) {
              unaff_R12 = (ulong)uVar4;
              pcVar20 = "diag";
              uVar15 = 0x4c1;
              goto LAB_001ef6fe;
            }
            pRVar14 = pRVar12->c2n;
            pRVar11 = pRVar12->e2n;
            if ((int)local_608 == 0) {
              lVar24 = (long)(pRVar12->size_per * iVar29);
              lVar26 = pRVar11[lVar13 * 2 + 1] + lVar24;
              lVar24 = pRVar11[lVar13 * 2] + lVar24;
              iVar22 = -1;
              iVar17 = -1;
              RVar23 = -1;
              RVar7 = -1;
            }
            else {
              lVar26 = (long)(pRVar12->size_per * iVar29);
              lVar24 = pRVar11[lVar13 * 2] + lVar26;
              iVar22 = pRVar14[lVar24];
              lVar26 = pRVar11[lVar13 * 2 + 1] + lVar26;
              iVar17 = pRVar14[lVar26];
              RVar23 = *(REF_INT *)((long)local_620 + (long)iVar17 * 4);
              RVar7 = *(REF_INT *)((long)local_620 + (long)iVar22 * 4);
            }
            uVar4 = ref_cell_has_side(local_638->cell[8],pRVar14[lVar26],
                                      *(REF_INT *)((long)local_620 + (long)pRVar14[lVar24] * 4),
                                      (REF_BOOL *)&local_608);
            if (uVar4 != 0) {
              unaff_R12 = (ulong)uVar4;
              pcVar20 = "diag";
              uVar15 = 0x4cd;
              goto LAB_001ef6fe;
            }
            if ((int)local_608 != 0) {
              lVar24 = (long)local_630->size_per * local_628;
              iVar22 = local_630->c2n[local_630->e2n[lVar13 * 2 + 1] + lVar24];
              iVar17 = local_630->c2n[(long)(int)lVar24 + (long)local_630->e2n[lVar13 * 2]];
              RVar23 = *(REF_INT *)((long)local_620 + (long)iVar17 * 4);
              RVar7 = *(REF_INT *)((long)local_620 + (long)iVar22 * 4);
            }
            if (iVar22 == -1) {
              pcVar20 = "diag not found";
              uVar15 = 0x4d4;
              goto LAB_001ef7a5;
            }
            local_438._0_4_ = iVar22;
            local_438._4_4_ = iVar17;
            local_430 = RVar23;
            RStack_42c = iVar22;
            uVar4 = ref_cell_with_face(local_638->cell[8],(REF_INT *)&local_438,
                                       (REF_INT *)&local_4c8,(REF_INT *)&local_5a8);
            if (uVar4 != 0) {
              unaff_R12 = (ulong)uVar4;
              pcVar20 = "tets";
              uVar15 = 0x4db;
              goto LAB_001ef6fe;
            }
            if (((uint)local_4c8 == 0xffffffff) && ((int)local_5a8 == -1)) {
              uVar4 = ref_layer_recover_face(local_638,(REF_INT *)&local_438);
              if (uVar4 != 0) {
                unaff_R12 = (ulong)uVar4;
                pcVar20 = "recover upper";
                uVar15 = 0x4dd;
                goto LAB_001ef6fe;
              }
              printf("lower tets %d %d\n",(ulong)(uint)local_4c8,(ulong)local_5a8 & 0xffffffff);
            }
            ref_grid = local_638;
            local_438._0_4_ = iVar22;
            local_438._4_4_ = RVar23;
            local_430 = RVar7;
            RStack_42c = iVar22;
            uVar4 = ref_cell_with_face(local_638->cell[8],(REF_INT *)&local_438,
                                       (REF_INT *)&local_4c8,(REF_INT *)&local_5a8);
            if (uVar4 != 0) {
              unaff_R12 = (ulong)uVar4;
              pcVar20 = "tets";
              uVar15 = 0x4e6;
              goto LAB_001ef6fe;
            }
            if (((uint)local_4c8 == 0xffffffff) && ((int)local_5a8 == -1)) {
              uVar4 = ref_layer_recover_face(ref_grid,(REF_INT *)&local_438);
              if (uVar4 != 0) {
                unaff_R12 = (ulong)uVar4;
                pcVar20 = "recover upper";
                uVar15 = 0x4e8;
                goto LAB_001ef6fe;
              }
              printf("upper tets %d %d\n",(ulong)(uint)local_4c8,(ulong)local_5a8 & 0xffffffff);
            }
            lVar13 = lVar13 + 1;
            pvVar9 = local_620;
          } while (lVar13 < local_630->edge_per);
        }
        iVar29 = iVar29 + 1;
        pRVar12 = local_630;
      } while (iVar29 < local_630->max);
      if (0 < local_630->max) {
        iVar29 = 0;
        do {
          RVar5 = ref_cell_nodes(local_630,iVar29,local_538);
          if ((((RVar5 == 0) && (*(int *)((long)pvVar9 + (long)local_538[0] * 4) != -1)) &&
              (*(int *)((long)pvVar9 + (long)local_538[1] * 4) != -1)) &&
             ((*(int *)((long)pvVar9 + (long)local_538[2] * 4) != -1 && (0 < local_630->edge_per))))
          {
            local_5f0 = (REF_NODE)(long)iVar29;
            lVar13 = 0;
            do {
              lVar24 = (long)local_630->size_per * (long)local_5f0;
              iVar22 = local_630->c2n[local_630->e2n[lVar13 * 2] + lVar24];
              iVar17 = local_630->c2n[(long)(int)lVar24 + (long)local_630->e2n[lVar13 * 2 + 1]];
              RVar23 = *(REF_INT *)((long)pvVar9 + (long)iVar17 * 4);
              RVar7 = *(REF_INT *)((long)pvVar9 + (long)iVar22 * 4);
              local_628 = CONCAT44(local_628._4_4_,RVar23);
              uVar4 = ref_cell_has_side(ref_grid->cell[8],iVar22,RVar23,(REF_BOOL *)&local_4c8);
              if (uVar4 != 0) {
                unaff_R12 = (ulong)uVar4;
                pcVar20 = "diag02";
                uVar15 = 0x4fe;
                goto LAB_001ef6fe;
              }
              uVar4 = ref_cell_has_side(ref_grid->cell[8],iVar17,RVar7,(REF_BOOL *)&local_5a8);
              if (uVar4 != 0) {
                unaff_R12 = (ulong)uVar4;
                pcVar20 = "diag13";
                uVar15 = 0x501;
                goto LAB_001ef6fe;
              }
              if (((uint)local_4c8 != 0) && ((int)local_5a8 != 0)) {
                puts("sliver");
                uVar4 = ref_layer_swap(local_638,iVar22,(REF_INT)local_628,iVar17,
                                       (REF_BOOL *)&local_438);
                if (uVar4 != 0) {
                  unaff_R12 = (ulong)uVar4;
                  pcVar20 = "quad1";
                  uVar15 = 0x3d0;
LAB_001f1e6c:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,uVar15,"ref_layer_remove_sliver",unaff_R12,pcVar20);
                  pcVar20 = "remove sliver";
                  uVar15 = 0x504;
                  goto LAB_001ef6fe;
                }
                if ((int)local_438 == 0) {
                  uVar4 = ref_layer_swap(local_638,iVar22,(REF_INT)local_628,RVar7,
                                         (REF_BOOL *)&local_438);
                  if (uVar4 != 0) {
                    unaff_R12 = (ulong)uVar4;
                    pcVar20 = "quad1";
                    uVar15 = 0x3d2;
                    goto LAB_001f1e6c;
                  }
                  if ((int)local_438 == 0) {
                    uVar4 = ref_layer_swap(local_638,iVar17,RVar7,iVar22,(REF_BOOL *)&local_438);
                    if (uVar4 != 0) {
                      unaff_R12 = (ulong)uVar4;
                      pcVar20 = "quad0";
                      uVar15 = 0x3d4;
                      goto LAB_001f1e6c;
                    }
                    if ((int)local_438 == 0) {
                      uVar4 = ref_layer_swap(local_638,iVar17,RVar7,(REF_INT)local_628,
                                             (REF_BOOL *)&local_438);
                      if (uVar4 != 0) {
                        unaff_R12 = (ulong)uVar4;
                        pcVar20 = "quad3";
                        uVar15 = 0x3d6;
                        goto LAB_001f1e6c;
                      }
                    }
                  }
                }
              }
              lVar13 = lVar13 + 1;
              pvVar9 = local_620;
              ref_grid = local_638;
            } while (lVar13 < local_630->edge_per);
          }
          iVar29 = iVar29 + 1;
          pRVar12 = local_630;
        } while (iVar29 < local_630->max);
      }
    }
  }
  uVar4 = ref_adj_create((REF_ADJ *)&local_608);
  if (uVar4 == 0) {
    if (0 < pRVar12->max) {
      uVar25 = 0;
      pvVar9 = local_620;
      do {
        RVar23 = (REF_INT)uVar25;
        RVar5 = ref_cell_nodes(pRVar12,RVar23,local_538);
        if (RVar5 == 0) {
          iVar29 = *(int *)((long)pvVar9 + (long)local_538[0] * 4);
          if (((iVar29 != -1) &&
              (iVar22 = *(int *)((long)pvVar9 + (long)local_538[1] * 4), iVar22 != -1)) &&
             (iVar17 = *(int *)((long)pvVar9 + (long)local_538[2] * 4), iVar17 != -1)) {
            pRVar28 = local_638->cell[8];
            local_5a8 = (REF_CAVITY)CONCAT44(local_538[1],local_538[0]);
            uStack_5a0 = (double)CONCAT44(iVar29,local_538[2]);
            local_598 = (double)CONCAT44(iVar17,iVar22);
            if (((-1 < local_538[0]) && (pRVar10 = pRVar28->ref_adj, local_538[0] < pRVar10->nnode))
               && (local_648 = (long)pRVar10->first[local_538[0]], local_648 != -1)) {
              pRVar3 = pRVar10->item + local_648;
              RVar7 = pRVar28->node_per;
              while( true ) {
                if (0 < RVar7) {
                  iVar29 = pRVar3->ref;
                  lVar13 = 0;
                  do {
                    if (*(int *)((long)pvVar9 + (long)local_538[0] * 4) ==
                        pRVar28->c2n[(long)pRVar28->size_per * (long)iVar29 + lVar13]) {
                      uVar4 = ref_cell_nodes(pRVar28,iVar29,(REF_INT *)&local_4c8);
                      if (uVar4 != 0) {
                        unaff_R12 = (ulong)uVar4;
                        pcVar20 = "tet";
                        uVar15 = 0x51e;
                        goto LAB_001ef6fe;
                      }
                      uVar4 = ref_layer_tet_prism((REF_INT *)&local_5a8,(REF_INT *)&local_4c8,
                                                  &local_63c);
                      if (uVar4 != 0) {
                        uVar15 = 0x51f;
                        goto LAB_001f195e;
                      }
                      if ((local_63c != 0) &&
                         (uVar4 = ref_adj_add_uniquely
                                            ((REF_ADJ)CONCAT44(local_608._4_4_,(int)local_608),
                                             RVar23,iVar29), uVar4 != 0)) {
                        unaff_R12 = (ulong)uVar4;
                        pcVar20 = "add";
                        uVar15 = 0x521;
                        goto LAB_001ef6fe;
                      }
                    }
                    RVar7 = pRVar28->node_per;
                    lVar13 = lVar13 + 1;
                    pvVar9 = local_620;
                  } while ((int)lVar13 < RVar7);
                }
                pRVar3 = pRVar28->ref_adj->item;
                local_648 = (long)pRVar3[(int)local_648].next;
                pRVar12 = local_630;
                if (local_648 == -1) break;
                pRVar3 = pRVar3 + local_648;
              }
            }
            if (((-1 < local_538[1]) && (pRVar10 = pRVar28->ref_adj, local_538[1] < pRVar10->nnode))
               && (local_648 = (long)pRVar10->first[(uint)local_538[1]], local_648 != -1)) {
              pRVar3 = pRVar10->item + local_648;
              RVar7 = pRVar28->node_per;
              while( true ) {
                if (0 < RVar7) {
                  iVar29 = pRVar3->ref;
                  lVar13 = 0;
                  do {
                    if (*(int *)((long)pvVar9 + (long)local_538[1] * 4) ==
                        pRVar28->c2n[(long)pRVar28->size_per * (long)iVar29 + lVar13]) {
                      uVar4 = ref_cell_nodes(pRVar28,iVar29,(REF_INT *)&local_4c8);
                      if (uVar4 != 0) {
                        unaff_R12 = (ulong)uVar4;
                        pcVar20 = "tet";
                        uVar15 = 0x526;
                        goto LAB_001ef6fe;
                      }
                      uVar4 = ref_layer_tet_prism((REF_INT *)&local_5a8,(REF_INT *)&local_4c8,
                                                  &local_63c);
                      if (uVar4 != 0) {
                        uVar15 = 0x527;
                        goto LAB_001f195e;
                      }
                      if ((local_63c != 0) &&
                         (uVar4 = ref_adj_add_uniquely
                                            ((REF_ADJ)CONCAT44(local_608._4_4_,(int)local_608),
                                             RVar23,iVar29), uVar4 != 0)) {
                        unaff_R12 = (ulong)uVar4;
                        pcVar20 = "add";
                        uVar15 = 0x529;
                        goto LAB_001ef6fe;
                      }
                    }
                    RVar7 = pRVar28->node_per;
                    lVar13 = lVar13 + 1;
                    pvVar9 = local_620;
                  } while ((int)lVar13 < RVar7);
                }
                pRVar3 = pRVar28->ref_adj->item;
                local_648 = (long)pRVar3[(int)local_648].next;
                pRVar12 = local_630;
                if (local_648 == -1) break;
                pRVar3 = pRVar3 + local_648;
              }
            }
            if (((-1 < (long)local_538[2]) &&
                (pRVar10 = pRVar28->ref_adj, local_538[2] < pRVar10->nnode)) &&
               (local_648 = (long)pRVar10->first[local_538[2]], local_648 != -1)) {
              pRVar3 = pRVar10->item + local_648;
              RVar7 = pRVar28->node_per;
              do {
                if (0 < RVar7) {
                  iVar29 = pRVar3->ref;
                  lVar13 = 0;
                  do {
                    if (*(int *)((long)pvVar9 + (long)local_538[2] * 4) ==
                        pRVar28->c2n[(long)pRVar28->size_per * (long)iVar29 + lVar13]) {
                      uVar4 = ref_cell_nodes(pRVar28,iVar29,(REF_INT *)&local_4c8);
                      if (uVar4 != 0) {
                        unaff_R12 = (ulong)uVar4;
                        pcVar20 = "tet";
                        uVar15 = 0x52e;
                        goto LAB_001ef6fe;
                      }
                      uVar4 = ref_layer_tet_prism((REF_INT *)&local_5a8,(REF_INT *)&local_4c8,
                                                  &local_63c);
                      if (uVar4 != 0) {
                        uVar15 = 0x52f;
LAB_001f195e:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,uVar15,"ref_layer_align_prism",(ulong)uVar4,"contains");
                        return 1;
                      }
                      if ((local_63c != 0) &&
                         (uVar4 = ref_adj_add_uniquely
                                            ((REF_ADJ)CONCAT44(local_608._4_4_,(int)local_608),
                                             RVar23,iVar29), uVar4 != 0)) {
                        unaff_R12 = (ulong)uVar4;
                        pcVar20 = "add";
                        uVar15 = 0x531;
                        goto LAB_001ef6fe;
                      }
                    }
                    RVar7 = pRVar28->node_per;
                    lVar13 = lVar13 + 1;
                    pvVar9 = local_620;
                  } while ((int)lVar13 < RVar7);
                }
                pRVar3 = pRVar28->ref_adj->item;
                local_648 = (long)pRVar3[(int)local_648].next;
                pRVar12 = local_630;
                if (local_648 == -1) break;
                pRVar3 = pRVar3 + local_648;
              } while( true );
            }
            uVar4 = ref_adj_degree((REF_ADJ)CONCAT44(local_608._4_4_,(int)local_608),RVar23,
                                   (REF_INT *)&local_5e8);
            if (uVar4 != 0) {
              unaff_R12 = (ulong)uVar4;
              pcVar20 = "deg";
              uVar15 = 0x535;
              goto LAB_001ef6fe;
            }
            if (local_5e8 != 3) {
              uVar4 = ref_cavity_create(&local_610);
              if (uVar4 != 0) {
                unaff_R12 = (ulong)uVar4;
                pcVar20 = "cav create";
                uVar15 = 0x539;
                goto LAB_001ef6fe;
              }
              uVar4 = ref_cavity_form_empty(local_610,local_638,-1);
              if (uVar4 != 0) {
                unaff_R12 = (ulong)uVar4;
                pcVar20 = "empty";
                uVar15 = 0x53a;
                goto LAB_001ef6fe;
              }
              piVar1 = (int *)CONCAT44(local_608._4_4_,(int)local_608);
              if (((long)uVar25 < (long)*piVar1) &&
                 (iVar29 = *(int *)(*(long *)(piVar1 + 2) + uVar25 * 4), iVar29 != -1)) {
                lVar13 = *(long *)(piVar1 + 4);
                do {
                  uVar4 = ref_cavity_add_tet(local_610,*(REF_INT *)(lVar13 + 4 + (long)iVar29 * 8));
                  if (uVar4 != 0) {
                    unaff_R12 = (ulong)uVar4;
                    pcVar20 = "add tet";
                    uVar15 = 0x53c;
                    goto LAB_001ef6fe;
                  }
                  lVar13 = *(long *)(CONCAT44(local_608._4_4_,(int)local_608) + 0x10);
                  iVar29 = *(int *)(lVar13 + (long)iVar29 * 8);
                } while (iVar29 != -1);
              }
              snprintf((char *)&local_438,0x400,"prism-%d-cav.tec",uVar25 & 0xffffffff);
              printf("prism tets %d %s\n",(ulong)local_5e8,&local_438);
              uVar4 = ref_cavity_tec(local_610,(char *)&local_438);
              if (uVar4 != 0) {
                unaff_R12 = (ulong)uVar4;
                pcVar20 = "cav tec";
                uVar15 = 0x540;
                goto LAB_001ef6fe;
              }
              uVar4 = ref_cavity_free(local_610);
              if (uVar4 != 0) {
                unaff_R12 = (ulong)uVar4;
                pcVar20 = "cav free";
                uVar15 = 0x541;
                goto LAB_001ef6fe;
              }
              pvVar9 = local_620;
              if (local_5e8 != 3) goto LAB_001f098a;
            }
            piVar1 = (int *)CONCAT44(local_608._4_4_,(int)local_608);
            if (((long)uVar25 < (long)*piVar1) &&
               (iVar29 = *(int *)(*(long *)(piVar1 + 2) + uVar25 * 4), iVar29 != -1)) {
              lVar13 = *(long *)(piVar1 + 4);
              do {
                uVar4 = ref_cell_remove(local_638->cell[8],
                                        *(REF_INT *)(lVar13 + 4 + (long)iVar29 * 8));
                if (uVar4 != 0) {
                  unaff_R12 = (ulong)uVar4;
                  pcVar20 = "rm tet";
                  uVar15 = 0x546;
                  goto LAB_001ef6fe;
                }
                lVar13 = *(long *)(CONCAT44(local_608._4_4_,(int)local_608) + 0x10);
                iVar29 = *(int *)(lVar13 + (long)iVar29 * 8);
              } while (iVar29 != -1);
            }
            uVar4 = ref_cell_add(local_638->cell[10],(REF_INT *)&local_5a8,(REF_INT *)&local_438);
            pvVar9 = local_620;
            if (uVar4 != 0) {
              unaff_R12 = (ulong)uVar4;
              pcVar20 = "add pri";
              uVar15 = 0x549;
              goto LAB_001ef6fe;
            }
          }
        }
LAB_001f098a:
        uVar25 = uVar25 + 1;
      } while ((long)uVar25 < (long)pRVar12->max);
    }
    uVar4 = ref_adj_free((REF_ADJ)CONCAT44(local_608._4_4_,(int)local_608));
    if (uVar4 == 0) {
      pRVar12 = local_638->cell[10];
      ref_grid_00 = local_638;
      if (0 < pRVar12->max) {
        uVar4 = 0;
        do {
          RVar5 = ref_cell_nodes(pRVar12,uVar4,local_538);
          pRVar12 = ref_grid_00->cell[10];
          if ((RVar5 == 0) && (0 < pRVar12->face_per)) {
            lVar13 = (long)(int)uVar4;
            pRVar28 = (REF_CELL)0x0;
            do {
              uVar8 = ref_cavity_create((REF_CAVITY *)&local_4c8);
              if (uVar8 != 0) {
                unaff_R12 = (ulong)uVar8;
                pcVar20 = "cav create";
                uVar15 = 0x555;
                goto LAB_001ef6fe;
              }
              uVar8 = ref_cavity_form_empty
                                ((REF_CAVITY)CONCAT44(local_4c8._4_4_,(uint)local_4c8),ref_grid_00,
                                 -1);
              if (uVar8 != 0) {
                unaff_R12 = (ulong)uVar8;
                pcVar20 = "empty";
                uVar15 = 0x556;
                goto LAB_001ef6fe;
              }
              pRVar12 = ref_grid_00->cell[10];
              pRVar14 = pRVar12->f2n;
              pRVar11 = pRVar12->c2n;
              uVar25 = (long)pRVar28 * 4;
              uVar16 = pRVar12->size_per * lVar13;
              uVar8 = pRVar11[uVar16 + (long)pRVar14[(long)pRVar28 * 4]];
              local_630 = pRVar28;
              if (uVar8 != pRVar11[(long)(int)uVar16 + (long)pRVar14[(long)pRVar28 * 4 + 3]]) {
                if (((-1 < (int)uVar8) &&
                    (pRVar10 = ref_grid_00->cell[8]->ref_adj, (int)uVar8 < pRVar10->nnode)) &&
                   (lVar24 = (long)pRVar10->first[uVar8], lVar24 != -1)) {
                  pRVar3 = pRVar10->item + lVar24;
                  pRVar12 = ref_grid_00->cell[8];
                  local_628 = uVar25;
                  while( true ) {
                    if (0 < pRVar12->node_per) {
                      iVar29 = pRVar3->ref;
                      lVar26 = 0;
                      do {
                        pRVar28 = local_638->cell[10];
                        if (pRVar28->c2n
                            [pRVar28->size_per * lVar13 + (long)pRVar28->f2n[uVar25 | 2]] ==
                            pRVar12->c2n[(long)pRVar12->size_per * (long)iVar29 + lVar26]) {
                          uVar8 = ref_cavity_add_tet((REF_CAVITY)
                                                     CONCAT44(local_4c8._4_4_,(uint)local_4c8),
                                                     iVar29);
                          if (uVar8 != 0) {
                            unaff_R12 = (ulong)uVar8;
                            pcVar20 = "add tet";
                            uVar15 = 0x55e;
                            goto LAB_001ef6fe;
                          }
                          pRVar12 = local_638->cell[8];
                        }
                        lVar26 = lVar26 + 1;
                      } while ((int)lVar26 < pRVar12->node_per);
                    }
                    pRVar3 = pRVar12->ref_adj->item;
                    local_648._0_4_ = (int)lVar24;
                    lVar24 = (long)pRVar3[(int)local_648].next;
                    if (lVar24 == -1) break;
                    pRVar3 = pRVar3 + lVar24;
                  }
                  pRVar12 = local_638->cell[10];
                  pRVar14 = pRVar12->f2n;
                  pRVar11 = pRVar12->c2n;
                  uVar16 = (ulong)(pRVar12->size_per * uVar4);
                  ref_grid_00 = local_638;
                  uVar25 = local_628;
                }
                iVar29 = pRVar11[(long)(int)uVar16 + (long)pRVar14[uVar25 + 1]];
                if (((-1 < (long)iVar29) &&
                    (pRVar10 = ref_grid_00->cell[8]->ref_adj, iVar29 < pRVar10->nnode)) &&
                   (lVar24 = (long)pRVar10->first[iVar29], lVar24 != -1)) {
                  lVar26 = (long)local_630 * 4;
                  pRVar3 = pRVar10->item + lVar24;
                  pRVar12 = ref_grid_00->cell[8];
                  while( true ) {
                    if (0 < pRVar12->node_per) {
                      iVar29 = pRVar3->ref;
                      lVar27 = 0;
                      do {
                        pRVar28 = local_638->cell[10];
                        if (pRVar28->c2n
                            [pRVar28->size_per * lVar13 + (long)pRVar28->f2n[lVar26 + 3]] ==
                            pRVar12->c2n[(long)pRVar12->size_per * (long)iVar29 + lVar27]) {
                          uVar8 = ref_cavity_add_tet((REF_CAVITY)
                                                     CONCAT44(local_4c8._4_4_,(uint)local_4c8),
                                                     iVar29);
                          if (uVar8 != 0) {
                            unaff_R12 = (ulong)uVar8;
                            pcVar20 = "add tet";
                            uVar15 = 0x565;
                            goto LAB_001ef6fe;
                          }
                          pRVar12 = local_638->cell[8];
                        }
                        lVar27 = lVar27 + 1;
                      } while ((int)lVar27 < pRVar12->node_per);
                    }
                    pRVar3 = pRVar12->ref_adj->item;
                    local_648._0_4_ = (int)lVar24;
                    lVar24 = (long)pRVar3[(int)local_648].next;
                    ref_grid_00 = local_638;
                    if (lVar24 == -1) break;
                    pRVar3 = pRVar3 + lVar24;
                  }
                }
              }
              ref_cavity_00 = (REF_CAVITY)CONCAT44(local_4c8._4_4_,(uint)local_4c8);
              if ((ref_cavity_00->tet_list->n & 0xfffffffdU) != 0) {
                snprintf((char *)&local_438,0x400,"glue-%d-%d-cav.tec",(ulong)uVar4,local_630);
                printf("pyramid tets missing %d %s\n",
                       (ulong)**(uint **)(CONCAT44(local_4c8._4_4_,(uint)local_4c8) + 0x50),
                       &local_438);
                ref_cavity_00 = (REF_CAVITY)CONCAT44(local_4c8._4_4_,(uint)local_4c8);
                if (0 < ref_cavity_00->nface) {
                  uVar8 = ref_cavity_tec(ref_cavity_00,(char *)&local_438);
                  if (uVar8 != 0) {
                    unaff_R12 = (ulong)uVar8;
                    pcVar20 = "cav tec";
                    uVar15 = 0x56e;
                    goto LAB_001ef6fe;
                  }
                  ref_cavity_00 = (REF_CAVITY)CONCAT44(local_4c8._4_4_,(uint)local_4c8);
                }
              }
              pRVar12 = local_630;
              if (ref_cavity_00->tet_list->n == 2) {
                pRVar14 = ref_cavity_00->tet_list->value;
                uVar8 = ref_layer_tet_to_pyr(ref_grid_00,uVar4,*pRVar14,pRVar14[1]);
                if (uVar8 != 0) {
                  unaff_R12 = (ulong)uVar8;
                  pcVar20 = "tet2pyr";
                  uVar15 = 0x576;
                  goto LAB_001ef6fe;
                }
                ref_cavity_00 = (REF_CAVITY)CONCAT44(local_4c8._4_4_,(uint)local_4c8);
              }
              uVar8 = ref_cavity_free(ref_cavity_00);
              if (uVar8 != 0) {
                unaff_R12 = (ulong)uVar8;
                pcVar20 = "cav free";
                uVar15 = 0x578;
                goto LAB_001ef6fe;
              }
              pRVar28 = (REF_CELL)((long)&pRVar12->type + 1);
              pRVar12 = ref_grid_00->cell[10];
            } while ((long)pRVar28 < (long)pRVar12->face_per);
          }
          uVar4 = uVar4 + 1;
        } while ((int)uVar4 < pRVar12->max);
      }
      uVar4 = ref_export_by_extension(ref_grid_00,"ref_layer_prism_after.tec");
      if (uVar4 == 0) {
        free(local_620);
        free(local_5d0);
        return 0;
      }
      unaff_R12 = (ulong)uVar4;
      pcVar20 = "dump surf after";
      uVar15 = 0x57d;
    }
    else {
      unaff_R12 = (ulong)uVar4;
      pcVar20 = "free";
      uVar15 = 0x54d;
    }
  }
  else {
    unaff_R12 = (ulong)uVar4;
    pcVar20 = "tet list";
    uVar15 = 0x50e;
  }
LAB_001ef6fe:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar15,
         "ref_layer_align_prism",unaff_R12 & 0xffffffff,pcVar20);
  return (REF_STATUS)unaff_R12;
LAB_001f021c:
  if (local_5dc == -1) {
LAB_001f13c1:
    pcVar20 = "best tet empty";
    uVar15 = 0x357;
  }
  else {
    if (0.0 < (double)local_5c8) {
      uVar4 = ref_cavity_create((REF_CAVITY *)&local_5a8);
      if (uVar4 != 0) {
        unaff_R12 = (ulong)uVar4;
        pcVar20 = "cav create";
        uVar15 = 0x498;
        goto LAB_001ef6fe;
      }
      uVar4 = ref_cavity_form_empty(local_5a8,ref_grid,RVar23);
      if (uVar4 != 0) {
        unaff_R12 = (ulong)uVar4;
        pcVar20 = "empty";
        uVar15 = 0x499;
        goto LAB_001ef6fe;
      }
      uVar4 = ref_cavity_add_tet(local_5a8,iVar29);
      uVar25 = local_450;
      if (uVar4 != 0) {
        unaff_R12 = (ulong)uVar4;
        pcVar20 = "add tet";
        uVar15 = 0x49a;
        goto LAB_001ef6fe;
      }
      if ((ulong)local_5a8->state != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x49c,"ref_layer_align_prism","add tet not unknown",0,(ulong)local_5a8->state);
        return 1;
      }
      uVar4 = ref_cavity_enlarge_visible(local_5a8);
      if (uVar4 == 0) {
        if ((ulong)local_5a8->state != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x4a5,"ref_layer_align_prism","prism top not visible",1,(ulong)local_5a8->state);
          ref_cavity_tec(local_5a8,"ref_layer_prism_cavity.tec");
          ref_export_by_extension(ref_grid,"ref_layer_prism_mesh.tec");
          return 1;
        }
        uVar4 = ref_cavity_replace(local_5a8);
        if (uVar4 == 0) {
          uVar4 = ref_cavity_free(local_5a8);
          if (uVar4 != 0) {
            unaff_R12 = (ulong)uVar4;
            pcVar20 = "cav free";
            uVar15 = 0x4aa;
            goto LAB_001ef6fe;
          }
LAB_001eff22:
          lVar13 = local_5b0 + 1;
          pvVar9 = local_620;
          if (pRVar12->edge_per <= lVar13) goto LAB_001efe68;
          goto LAB_001efeb7;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x4a9,"ref_layer_align_prism",(ulong)uVar4,"cav replace");
        ref_cavity_tec(local_5a8,"ref_layer_prism_cavity.tec");
        pcVar20 = "ref_layer_prism_mesh.tec";
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x4a0,"ref_layer_align_prism",(ulong)uVar4,"enlarge");
        ref_cavity_tec(local_5a8,"cav-fail.tec");
        pcVar20 = "mesh-fail.tec";
      }
      ref_export_by_extension(ref_grid,pcVar20);
      return uVar4;
    }
    pcVar20 = "best vol not positive";
    uVar15 = 0x358;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar15,
         "ref_layer_seed_tet",pcVar20);
  unaff_R12 = 1;
LAB_001f13ef:
  pcVar20 = "seed";
  uVar15 = 0x497;
  goto LAB_001ef6fe;
}

Assistant:

REF_FCN REF_STATUS ref_layer_align_prism(REF_GRID ref_grid,
                                         REF_DICT ref_dict_bcs) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL *active;
  REF_INT *off_node;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  RSS(ref_export_by_extension(ref_grid, "ref_layer_prism_before.tec"),
      "dump surf");

  ref_malloc_init(active, ref_node_max(ref_node), REF_BOOL, REF_FALSE);
  ref_malloc_init(off_node, ref_node_max(ref_node), REF_BOOL, REF_EMPTY);
  /* mark active nodes */
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    REF_INT bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    if (ref_phys_wall_distance_bc(bc)) {
      REF_INT cell_node;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        active[nodes[cell_node]] = REF_TRUE;
      }
    }
  }

  RSS(ref_layer_prism_insert_hair(ref_grid, ref_dict_bcs, active, off_node),
      "insert hair");

  /* recover tet slides of prism tops, extend for boundary */
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
        REF_EMPTY != off_node[nodes[2]]) {
      REF_INT cell_edge;
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        REF_INT node0 = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
        REF_INT node1 = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
        REF_BOOL has_side;
        RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &has_side),
            "find tet side");
        if (!has_side) {
          REF_CAVITY ref_cavity;
          REF_INT tet;
          RSS(ref_layer_seed_tet(ref_grid, node0, node1, &tet), "seed");
          RSS(ref_cavity_create(&ref_cavity), "cav create");
          RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node1), "empty");
          RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
          REIS(REF_CAVITY_UNKNOWN, ref_cavity_state(ref_cavity),
               "add tet not unknown");
          RSB(ref_cavity_enlarge_visible(ref_cavity), "enlarge", {
            ref_cavity_tec(ref_cavity, "cav-fail.tec");
            ref_export_by_extension(ref_grid, "mesh-fail.tec");
          });
          REIB(REF_CAVITY_VISIBLE, ref_cavity_state(ref_cavity),
               "prism top not visible", {
                 ref_cavity_tec(ref_cavity, "ref_layer_prism_cavity.tec");
                 ref_export_by_extension(ref_grid, "ref_layer_prism_mesh.tec");
               });
          RSB(ref_cavity_replace(ref_cavity), "cav replace", {
            ref_cavity_tec(ref_cavity, "ref_layer_prism_cavity.tec");
            ref_export_by_extension(ref_grid, "ref_layer_prism_mesh.tec");
          });
          RSS(ref_cavity_free(ref_cavity), "cav free");
        }
      }
    }
  }
  /* recover prism sides */
  {
    REF_INT cell_edge;
    REF_INT quad[4], face_nodes[4], tet0, tet1;
    REF_BOOL has_side;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
          REF_EMPTY != off_node[nodes[2]]) {
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          quad[0] = REF_EMPTY;
          quad[1] = REF_EMPTY;
          quad[2] = REF_EMPTY;
          quad[3] = REF_EMPTY;
          RSS(ref_cell_has_side(
                  ref_grid_tet(ref_grid),
                  ref_cell_e2n(ref_cell, 0, cell_edge, cell),
                  off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)],
                  &has_side),
              "diag");
          if (has_side) {
            quad[0] = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
            quad[1] = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
            quad[2] = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
            quad[3] = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
          }
          RSS(ref_cell_has_side(
                  ref_grid_tet(ref_grid),
                  ref_cell_e2n(ref_cell, 1, cell_edge, cell),
                  off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)],
                  &has_side),
              "diag");
          if (has_side) {
            quad[0] = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
            quad[1] = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
            quad[2] = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
            quad[3] = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
          }
          RUS(REF_EMPTY, quad[0], "diag not found");
          face_nodes[0] = quad[0];
          face_nodes[1] = quad[1];
          face_nodes[2] = quad[2];
          face_nodes[3] = face_nodes[0];
          RSS(ref_cell_with_face(ref_grid_tet(ref_grid), face_nodes, &tet0,
                                 &tet1),
              "tets");
          if (tet0 == REF_EMPTY && tet1 == REF_EMPTY) {
            RSS(ref_layer_recover_face(ref_grid, face_nodes), "recover upper");
            printf("lower tets %d %d\n", tet0, tet1);
          }
          face_nodes[0] = quad[0];
          face_nodes[1] = quad[2];
          face_nodes[2] = quad[3];
          face_nodes[3] = face_nodes[0];
          RSS(ref_cell_with_face(ref_grid_tet(ref_grid), face_nodes, &tet0,
                                 &tet1),
              "tets");
          if (tet0 == REF_EMPTY && tet1 == REF_EMPTY) {
            RSS(ref_layer_recover_face(ref_grid, face_nodes), "recover upper");
            printf("upper tets %d %d\n", tet0, tet1);
          }
        }
      }
    }
  }
  /* remove quad slivers */
  {
    REF_INT cell_edge;
    REF_INT quad[4];
    REF_BOOL has_diag02, has_diag13;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
          REF_EMPTY != off_node[nodes[2]]) {
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          quad[0] = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
          quad[1] = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
          quad[2] = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
          quad[3] = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
          RSS(ref_cell_has_side(ref_grid_tet(ref_grid), quad[0], quad[2],
                                &has_diag02),
              "diag02");
          RSS(ref_cell_has_side(ref_grid_tet(ref_grid), quad[1], quad[3],
                                &has_diag13),
              "diag13");
          if (has_diag02 && has_diag13) {
            printf("sliver\n");
            RSS(ref_layer_remove_sliver(ref_grid, quad), "remove sliver");
          }
        }
      }
    }
  }
  /* replace tets with prism */
  {
    REF_ADJ tri_tet;
    REF_INT deg;
    RSS(ref_adj_create(&tri_tet), "tet list");
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
          REF_EMPTY != off_node[nodes[2]]) {
        REF_CELL ref_tet = ref_grid_tet(ref_grid);
        REF_INT cell_node, tet, tet_nodes[REF_CELL_MAX_SIZE_PER],
            pri_nodes[REF_CELL_MAX_SIZE_PER];
        REF_BOOL contains;
        pri_nodes[0] = nodes[0];
        pri_nodes[1] = nodes[1];
        pri_nodes[2] = nodes[2];
        pri_nodes[3] = off_node[nodes[0]];
        pri_nodes[4] = off_node[nodes[1]];
        pri_nodes[5] = off_node[nodes[2]];
        each_ref_cell_having_node2(ref_tet, nodes[0], off_node[nodes[0]], item,
                                   cell_node, tet) {
          RSS(ref_cell_nodes(ref_tet, tet, tet_nodes), "tet");
          RSS(ref_layer_tet_prism(pri_nodes, tet_nodes, &contains), "contains");
          if (contains) {
            RSS(ref_adj_add_uniquely(tri_tet, cell, tet), "add");
          }
        }
        each_ref_cell_having_node2(ref_tet, nodes[1], off_node[nodes[1]], item,
                                   cell_node, tet) {
          RSS(ref_cell_nodes(ref_tet, tet, tet_nodes), "tet");
          RSS(ref_layer_tet_prism(pri_nodes, tet_nodes, &contains), "contains");
          if (contains) {
            RSS(ref_adj_add_uniquely(tri_tet, cell, tet), "add");
          }
        }
        each_ref_cell_having_node2(ref_tet, nodes[2], off_node[nodes[2]], item,
                                   cell_node, tet) {
          RSS(ref_cell_nodes(ref_tet, tet, tet_nodes), "tet");
          RSS(ref_layer_tet_prism(pri_nodes, tet_nodes, &contains), "contains");
          if (contains) {
            RSS(ref_adj_add_uniquely(tri_tet, cell, tet), "add");
          }
        }

        RSS(ref_adj_degree(tri_tet, cell, &deg), "deg");
        if (3 != deg) {
          REF_CAVITY ref_cavity;
          char filename[1024];
          RSS(ref_cavity_create(&ref_cavity), "cav create");
          RSS(ref_cavity_form_empty(ref_cavity, ref_grid, REF_EMPTY), "empty");
          each_ref_adj_node_item_with_ref(tri_tet, cell, item, tet) {
            RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
          }
          snprintf(filename, 1024, "prism-%d-cav.tec", cell);
          printf("prism tets %d %s\n", deg, filename);
          RSS(ref_cavity_tec(ref_cavity, filename), "cav tec");
          RSS(ref_cavity_free(ref_cavity), "cav free");
        }
        if (3 == deg) {
          REF_INT new_pri;
          each_ref_adj_node_item_with_ref(tri_tet, cell, item, tet) {
            RSS(ref_cell_remove(ref_grid_tet(ref_grid), tet), "rm tet");
          }
          RSS(ref_cell_add(ref_grid_pri(ref_grid), pri_nodes, &new_pri),
              "add pri");
        }
      }
    }
    RSS(ref_adj_free(tri_tet), "free");
  }
  /* replace two tets with pyramid */
  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    REF_CAVITY ref_cavity;
    char filename[1024];
    REF_INT cell_face, tet, cell_node;
    each_ref_cell_cell_face(ref_grid_pri(ref_grid), cell_face) {
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      RSS(ref_cavity_form_empty(ref_cavity, ref_grid, REF_EMPTY), "empty");
      if (ref_cell_f2n(ref_grid_pri(ref_grid), 0, cell_face, cell) !=
          ref_cell_f2n(ref_grid_pri(ref_grid), 3, cell_face, cell)) {
        each_ref_cell_having_node2(
            ref_grid_tet(ref_grid),
            ref_cell_f2n(ref_grid_pri(ref_grid), 0, cell_face, cell),
            ref_cell_f2n(ref_grid_pri(ref_grid), 2, cell_face, cell), item,
            cell_node, tet) {
          RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
        }
        each_ref_cell_having_node2(
            ref_grid_tet(ref_grid),
            ref_cell_f2n(ref_grid_pri(ref_grid), 1, cell_face, cell),
            ref_cell_f2n(ref_grid_pri(ref_grid), 3, cell_face, cell), item,
            cell_node, tet) {
          RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
        }
      }
      if (2 != ref_list_n(ref_cavity_tet_list(ref_cavity)) &&
          0 != ref_list_n(ref_cavity_tet_list(ref_cavity))) {
        snprintf(filename, 1024, "glue-%d-%d-cav.tec", cell, cell_face);
        printf("pyramid tets missing %d %s\n",
               ref_list_n(ref_cavity_tet_list(ref_cavity)), filename);
        if (0 < ref_cavity_nface(ref_cavity))
          RSS(ref_cavity_tec(ref_cavity, filename), "cav tec");
      }
      if (2 == ref_list_n(ref_cavity_tet_list(ref_cavity))) {
        /* replace two tets with pyramid */
        RSS(ref_layer_tet_to_pyr(
                ref_grid, cell,
                ref_list_value(ref_cavity_tet_list(ref_cavity), 0),
                ref_list_value(ref_cavity_tet_list(ref_cavity), 1)),
            "tet2pyr");
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
    }
  }

  RSS(ref_export_by_extension(ref_grid, "ref_layer_prism_after.tec"),
      "dump surf after");
  ref_free(off_node);
  ref_free(active);

  return REF_SUCCESS;
}